

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2.h
# Opt level: O0

int upb_Log2Ceiling(int x)

{
  uint uVar1;
  undefined4 local_c;
  int x_local;
  
  if (x < 2) {
    local_c = 0;
  }
  else {
    uVar1 = 0x1f;
    if (x - 1U != 0) {
      for (; x - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    local_c = 0x20 - (uVar1 ^ 0x1f);
  }
  return local_c;
}

Assistant:

UPB_INLINE int upb_Log2Ceiling(int x) {
  if (x <= 1) return 0;
#ifdef __GNUC__
  return 32 - __builtin_clz(x - 1);
#else
  int lg2 = 0;
  while ((1 << lg2) < x) lg2++;
  return lg2;
#endif
}